

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall
soplex::SVSetBase<double>::xtend(SVSetBase<double> *this,SVectorBase<double> *svec,int newmax)

{
  int iVar1;
  DLPSV *pDVar2;
  DLPSV **ppDVar3;
  int in_EDX;
  DLPSV *in_RSI;
  SVSetBase<double> *in_RDI;
  int prevsz;
  SVectorBase<double> *prev;
  SVectorBase<double> newps;
  int sz;
  DLPSV *ps;
  undefined8 in_stack_ffffffffffffff58;
  int n;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  DLPSV *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  SVectorBase<double> *in_stack_ffffffffffffff78;
  DLPSV *pDVar4;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  SVectorBase<double> local_38;
  int local_24;
  DLPSV *local_20;
  int local_14;
  DLPSV *local_10;
  
  n = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar1 = SVectorBase<double>::max(&in_RSI->super_SVectorBase<double>);
  if (iVar1 < local_14) {
    local_20 = local_10;
    local_24 = SVectorBase<double>::size(&local_10->super_SVectorBase<double>);
    pDVar4 = local_20;
    pDVar2 = IdList<soplex::SVSetBase<double>::DLPSV>::last(&in_RDI->list);
    if (pDVar4 == pDVar2) {
      SVectorBase<double>::max(&local_20->super_SVectorBase<double>);
      ensureMem(in_RDI,(int)((ulong)pDVar4 >> 0x20),SUB81((ulong)pDVar4 >> 0x18,0));
      memSize((SVSetBase<double> *)0x266099);
      SVectorBase<double>::max(&local_20->super_SVectorBase<double>);
      ClassArray<soplex::Nonzero<double>_>::insert
                ((ClassArray<soplex::Nonzero<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
      iVar1 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      SVectorBase<double>::max(&local_20->super_SVectorBase<double>);
      updateUnusedMemEstimation
                ((SVSetBase<double> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 iVar1);
      SVectorBase<double>::mem(&local_20->super_SVectorBase<double>);
      SVectorBase<double>::setMem
                ((SVectorBase<double> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar1,
                 (Nonzero<double> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      SVectorBase<double>::set_size(&local_20->super_SVectorBase<double>,local_24);
    }
    else {
      ensureMem(in_RDI,(int)((ulong)pDVar4 >> 0x20),SUB81((ulong)pDVar4 >> 0x18,0));
      SVectorBase<double>::SVectorBase
                ((SVectorBase<double> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),n,
                 (Nonzero<double> *)0x266166);
      iVar1 = ClassArray<soplex::Nonzero<double>_>::size
                        (&in_RDI->super_ClassArray<soplex::Nonzero<double>_>);
      if (iVar1 < 1) {
        in_stack_ffffffffffffff80 = local_14;
        ClassArray<soplex::Nonzero<double>_>::get_ptr
                  (&in_RDI->super_ClassArray<soplex::Nonzero<double>_>);
        SVectorBase<double>::setMem
                  ((SVectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (Nonzero<double> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
      }
      else {
        in_stack_ffffffffffffff84 = local_14;
        ClassArray<soplex::Nonzero<double>_>::last
                  (&in_RDI->super_ClassArray<soplex::Nonzero<double>_>);
        SVectorBase<double>::setMem
                  ((SVectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (Nonzero<double> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
      }
      memSize((SVSetBase<double> *)0x2661d1);
      ClassArray<soplex::Nonzero<double>_>::insert
                ((ClassArray<soplex::Nonzero<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
      SVectorBase<double>::operator=
                ((SVectorBase<double> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      pDVar4 = local_20;
      pDVar2 = IdList<soplex::SVSetBase<double>::DLPSV>::first(&in_RDI->list);
      if (pDVar4 != pDVar2) {
        ppDVar3 = DLPSV::prev(local_20);
        pDVar4 = *ppDVar3;
        iVar1 = SVectorBase<double>::size(&pDVar4->super_SVectorBase<double>);
        in_stack_ffffffffffffff68 = pDVar4;
        in_stack_ffffffffffffff64 = SVectorBase<double>::max(&pDVar4->super_SVectorBase<double>);
        in_stack_ffffffffffffff74 = SVectorBase<double>::max(&local_20->super_SVectorBase<double>);
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff64 + in_stack_ffffffffffffff74;
        SVectorBase<double>::mem(&pDVar4->super_SVectorBase<double>);
        SVectorBase<double>::setMem
                  ((SVectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (Nonzero<double> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
        SVectorBase<double>::set_size(&pDVar4->super_SVectorBase<double>,iVar1);
      }
      SVectorBase<double>::size(&local_20->super_SVectorBase<double>);
      updateUnusedMemEstimation
                ((SVSetBase<double> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      IdList<soplex::SVSetBase<double>::DLPSV>::remove(&in_RDI->list,(char *)local_20);
      IdList<soplex::SVSetBase<double>::DLPSV>::append
                ((IdList<soplex::SVSetBase<double>::DLPSV> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      iVar1 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      SVectorBase<double>::mem(&local_38);
      SVectorBase<double>::setMem
                ((SVectorBase<double> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar1,
                 (Nonzero<double> *)CONCAT44(in_stack_ffffffffffffff64,local_14));
      SVectorBase<double>::set_size(&local_20->super_SVectorBase<double>,local_24);
    }
  }
  return;
}

Assistant:

void xtend(SVectorBase<R>& svec, int newmax)
   {
      if(svec.max() < newmax)
      {
         assert(has(&svec));

         DLPSV* ps = static_cast<DLPSV*>(&svec);
         int sz = ps->size();

         if(ps == list.last())
         {
            // because we want to extend the last vector we must not shrink its max memory usage
            // in order to ensure the missing memory
            ensureMem(newmax - ps->max(), false);
#ifndef NDEBUG
            Nonzero<R>* olddata = SVSetBaseArray::data;
            SVSetBaseArray::insert(memSize(), newmax - ps->max());
            assert(olddata == SVSetBaseArray::data);
#else
            SVSetBaseArray::insert(memSize(), newmax - ps->max());
#endif

            // decrease counter of unused memory (assume that new entries will be used)
#ifdef SOPLEX_DEBUG
            SPxOut::debug(this, "xtend (1), this = {} : updateUnusedMemEstimation -= {}\n", (void*)this,
                          ps->max() - sz);
#endif
            updateUnusedMemEstimation(sz - ps->max());

            ps->setMem(newmax, ps->mem());
            ps->set_size(sz);
         }
         else
         {
            ensureMem(newmax);
            SVectorBase<R> newps(0, nullptr);

            if(SVSetBaseArray::size() > 0)
               newps.setMem(newmax, &SVSetBaseArray::last() + 1);
            else
               newps.setMem(newmax, SVSetBaseArray::get_ptr());

#ifndef NDEBUG
            Nonzero<R>* olddata = SVSetBaseArray::data;
            SVSetBaseArray::insert(memSize(), newmax);
            assert(olddata == SVSetBaseArray::data);
#else
            SVSetBaseArray::insert(memSize(), newmax);
#endif

            newps = svec;

            if(ps != list.first())
            {
               SVectorBase<R>* prev = ps->prev();
               int prevsz = prev->size();
               prev->setMem(prev->max() + ps->max(), prev->mem());
               prev->set_size(prevsz);
            }

            // increase counter of unused memory (assume that new entries will be used)
#ifdef SOPLEX_DEBUG
            SPxOut::debug(this, "xtend (2), this = {} : updateUnusedMemEstimation += {}\n", (void*)this,
                          ps->size());
#endif
            updateUnusedMemEstimation(ps->size());

            list.remove(ps);
            list.append(ps);

            ps->setMem(newmax, newps.mem());
            ps->set_size(sz);
         }
      }
   }